

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

unsigned_long
flexbuffers::ReadSizedScalar<unsigned_long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (uint8_t *data,uint8_t byte_width)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  uint8_t byte_width_local;
  uint8_t *data_local;
  
  if (byte_width < 4) {
    if (byte_width < 2) {
      bVar1 = flatbuffers::ReadScalar<unsigned_char>(data);
      local_20 = (ulong)bVar1;
    }
    else {
      uVar2 = flatbuffers::ReadScalar<unsigned_short>(data);
      local_20 = (ulong)uVar2;
    }
    local_28 = local_20;
  }
  else {
    if (byte_width < 8) {
      uVar3 = flatbuffers::ReadScalar<unsigned_int>(data);
      local_30 = (ulong)uVar3;
    }
    else {
      local_30 = flatbuffers::ReadScalar<unsigned_long>(data);
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

R ReadSizedScalar(const uint8_t *data, uint8_t byte_width) {
  return byte_width < 4
             ? (byte_width < 2
                    ? static_cast<R>(flatbuffers::ReadScalar<T1>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T2>(data)))
             : (byte_width < 8
                    ? static_cast<R>(flatbuffers::ReadScalar<T4>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T8>(data)));
}